

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap2d_qualities.cpp
# Opt level: O1

Reals __thiscall
Omega_h::swap2d_qualities_tmpl<2>(Omega_h *this,Mesh *mesh,AdaptOpts *opts,LOs *cands2edges)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int *piVar2;
  Alloc *pAVar3;
  void *extraout_RDX;
  Int ent_dim;
  LO size_in;
  size_t sVar4;
  Reals RVar5;
  Write<double> cand_quals_w;
  Read<signed_char> et_codes;
  LOs et2t;
  LOs e2et;
  Reals cand_quals;
  Read<signed_char> edges_are_owned;
  LOs tri_verts2verts;
  LOs edge_verts2verts;
  MetricEdgeLengths<2,_2> length_measure;
  MetricElementQualities<2,_2> quality_measure;
  type f;
  Adj e2t;
  Write<double> local_218;
  Alloc *local_208;
  element_type *local_200;
  Alloc *local_1f8;
  element_type *local_1f0;
  Alloc *local_1e8;
  element_type *local_1e0;
  LOs local_1d8;
  Alloc *local_1c8;
  void *local_1c0;
  Write<double> local_1b8;
  Read<signed_char> local_1a8;
  Alloc *local_198;
  element_type *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  element_type *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  MetricEdgeLengths<2,_2> local_160;
  MetricElementQualities<2,_2> local_140;
  type local_120;
  Adj local_58;
  
  Mesh::ask_up(&local_58,mesh,1,2);
  local_1e8 = local_58.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8 = (Alloc *)((local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1e0 = (element_type *)local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_1f8 = local_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8 = (Alloc *)((local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1f0 = (element_type *)local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_208 = local_58.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_58.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208 = (Alloc *)((local_58.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.codes.write_.shared_alloc_.alloc)->use_count =
           (local_58.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_200 = (element_type *)local_58.codes.write_.shared_alloc_.direct_ptr;
  ent_dim = (Int)mesh;
  Mesh::ask_verts_of((Mesh *)&local_178,ent_dim);
  Mesh::ask_verts_of((Mesh *)&local_188,ent_dim);
  Mesh::owned((Mesh *)&local_198,ent_dim);
  MetricElementQualities<2,_2>::MetricElementQualities(&local_140,mesh);
  MetricEdgeLengths<2,_2>::MetricEdgeLengths(&local_160,mesh);
  pAVar3 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar4 = pAVar3->size;
  }
  else {
    sVar4 = (ulong)pAVar3 >> 3;
  }
  local_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)opts->max_length_allowed;
  local_120.cands2edges.write_.shared_alloc_.alloc = (Alloc *)&local_120.edges_are_owned;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  size_in = (LO)(sVar4 >> 2);
  Write<double>::Write(&local_218,size_in,(string *)&local_120);
  if (local_120.cands2edges.write_.shared_alloc_.alloc != (Alloc *)&local_120.edges_are_owned) {
    operator_delete(local_120.cands2edges.write_.shared_alloc_.alloc,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)&(local_120.edges_are_owned.write_.shared_alloc_.alloc)->size
                                   )->_M_ptr + 1));
  }
  local_120.cands2edges.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_120.cands2edges.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.cands2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.cands2edges.write_.shared_alloc_.alloc =
           (Alloc *)((local_120.cands2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_120.cands2edges.write_.shared_alloc_.alloc)->use_count =
           (local_120.cands2edges.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.cands2edges.write_.shared_alloc_.direct_ptr =
       (cands2edges->write_).shared_alloc_.direct_ptr;
  local_120.edges_are_owned.write_.shared_alloc_.alloc = local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.edges_are_owned.write_.shared_alloc_.alloc = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_120.edges_are_owned.write_.shared_alloc_.direct_ptr = local_190;
  local_120.cand_quals_w.shared_alloc_.alloc = local_218.shared_alloc_.alloc;
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.cand_quals_w.shared_alloc_.alloc =
           (Alloc *)((local_218.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_218.shared_alloc_.alloc)->use_count = (local_218.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.cand_quals_w.shared_alloc_.direct_ptr = local_218.shared_alloc_.direct_ptr;
  local_120.e2et.write_.shared_alloc_.alloc = local_1e8;
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.e2et.write_.shared_alloc_.alloc = (Alloc *)(local_1e8->size * 8 + 1);
    }
    else {
      local_1e8->use_count = local_1e8->use_count + 1;
    }
  }
  local_120.e2et.write_.shared_alloc_.direct_ptr = local_1e0;
  local_120.et_codes.write_.shared_alloc_.alloc = local_208;
  if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.et_codes.write_.shared_alloc_.alloc = (Alloc *)(local_208->size * 8 + 1);
    }
    else {
      local_208->use_count = local_208->use_count + 1;
    }
  }
  local_120.et_codes.write_.shared_alloc_.direct_ptr = local_200;
  local_120.et2t.write_.shared_alloc_.alloc = local_1f8;
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.et2t.write_.shared_alloc_.alloc = (Alloc *)(local_1f8->size * 8 + 1);
    }
    else {
      local_1f8->use_count = local_1f8->use_count + 1;
    }
  }
  local_120.et2t.write_.shared_alloc_.direct_ptr = local_1f0;
  local_120.tri_verts2verts.write_.shared_alloc_.alloc = (Alloc *)local_188._M_pi;
  if (((ulong)local_188._M_pi & 7) == 0 && (Alloc *)local_188._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.tri_verts2verts.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_188._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_188._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_188._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_120.tri_verts2verts.write_.shared_alloc_.direct_ptr = local_180;
  local_120.length_measure.coords.write_.shared_alloc_.alloc =
       local_160.coords.write_.shared_alloc_.alloc;
  if (((ulong)local_160.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_160.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.length_measure.coords.write_.shared_alloc_.alloc =
           (Alloc *)((local_160.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_160.coords.write_.shared_alloc_.alloc)->use_count =
           (local_160.coords.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.length_measure.coords.write_.shared_alloc_.direct_ptr =
       local_160.coords.write_.shared_alloc_.direct_ptr;
  local_120.length_measure.metrics.write_.shared_alloc_.alloc =
       local_160.metrics.write_.shared_alloc_.alloc;
  if (((ulong)local_160.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_160.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.length_measure.metrics.write_.shared_alloc_.alloc =
           (Alloc *)((local_160.metrics.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_160.metrics.write_.shared_alloc_.alloc)->use_count =
           (local_160.metrics.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.length_measure.metrics.write_.shared_alloc_.direct_ptr =
       local_160.metrics.write_.shared_alloc_.direct_ptr;
  local_120.max_length = (Real)local_168._M_pi;
  local_120.edge_verts2verts.write_.shared_alloc_.alloc = (Alloc *)local_178._M_pi;
  if (((ulong)local_178._M_pi & 7) == 0 && (Alloc *)local_178._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.edge_verts2verts.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_178._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_178._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_178._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_120.edge_verts2verts.write_.shared_alloc_.direct_ptr = local_170;
  local_120.quality_measure.coords.write_.shared_alloc_.alloc =
       local_140.coords.write_.shared_alloc_.alloc;
  if (((ulong)local_140.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.quality_measure.coords.write_.shared_alloc_.alloc =
           (Alloc *)((local_140.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_140.coords.write_.shared_alloc_.alloc)->use_count =
           (local_140.coords.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.quality_measure.coords.write_.shared_alloc_.direct_ptr =
       local_140.coords.write_.shared_alloc_.direct_ptr;
  local_120.quality_measure.metrics.write_.shared_alloc_.alloc =
       local_140.metrics.write_.shared_alloc_.alloc;
  if (((ulong)local_140.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.quality_measure.metrics.write_.shared_alloc_.alloc =
           (Alloc *)((local_140.metrics.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_140.metrics.write_.shared_alloc_.alloc)->use_count =
           (local_140.metrics.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.quality_measure.metrics.write_.shared_alloc_.direct_ptr =
       local_140.metrics.write_.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,&local_120,"swap2d_qualities");
  local_1b8.shared_alloc_.alloc = local_218.shared_alloc_.alloc;
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8.shared_alloc_.alloc = (Alloc *)((local_218.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_218.shared_alloc_.alloc)->use_count = (local_218.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b8.shared_alloc_.direct_ptr = local_218.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_1a8,&local_1b8);
  pAVar3 = local_1b8.shared_alloc_.alloc;
  if (((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1b8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1b8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_1d8.write_.shared_alloc_.alloc = local_1a8.write_.shared_alloc_.alloc;
  if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1a8.write_.shared_alloc_.alloc)->use_count =
           (local_1a8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1d8.write_.shared_alloc_.direct_ptr = local_1a8.write_.shared_alloc_.direct_ptr;
  local_1c8 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)(local_1c8->size * 8 + 1);
    }
    else {
      local_1c8->use_count = local_1c8->use_count + 1;
    }
  }
  local_1c0 = (cands2edges->write_).shared_alloc_.direct_ptr;
  Mesh::sync_subset_array<double>
            ((Mesh *)this,ent_dim,(Read<double> *)0x1,&local_1d8,-1.0,(Int)&local_1c8);
  pAVar3 = local_1c8;
  if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
    piVar2 = &local_1c8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1c8);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_1d8.write_.shared_alloc_.alloc;
  if (((ulong)local_1d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1d8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1a8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1a8.write_.shared_alloc_.alloc);
      operator_delete(local_1a8.write_.shared_alloc_.alloc,0x48);
    }
  }
  swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::
  {lambda(int)#1}::~AdaptOpts((_lambda_int__1_ *)&local_120);
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_218.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_218.shared_alloc_.alloc);
      operator_delete(local_218.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_160.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_160.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_160.metrics.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_160.metrics.write_.shared_alloc_.alloc);
      operator_delete(local_160.metrics.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_160.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_160.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_160.coords.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_160.coords.write_.shared_alloc_.alloc);
      operator_delete(local_160.coords.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_140.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_140.metrics.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_140.metrics.write_.shared_alloc_.alloc);
      operator_delete(local_140.metrics.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_140.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_140.coords.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_140.coords.write_.shared_alloc_.alloc);
      operator_delete(local_140.coords.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    piVar2 = &local_198->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_198);
      operator_delete(local_198,0x48);
    }
  }
  if (((ulong)local_188._M_pi & 7) == 0 && (Alloc *)local_188._M_pi != (Alloc *)0x0) {
    p_Var1 = local_188._M_pi + 3;
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_188._M_pi);
      operator_delete(local_188._M_pi,0x48);
    }
  }
  if (((ulong)local_178._M_pi & 7) == 0 && (Alloc *)local_178._M_pi != (Alloc *)0x0) {
    p_Var1 = local_178._M_pi + 3;
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_178._M_pi);
      operator_delete(local_178._M_pi,0x48);
    }
  }
  pAVar3 = local_208;
  if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
    piVar2 = &local_208->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_208);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_1f8;
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    piVar2 = &local_1f8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1f8);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_1e8;
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    piVar2 = &local_1e8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1e8);
      operator_delete(pAVar3,0x48);
    }
  }
  Adj::~Adj(&local_58);
  RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals swap2d_qualities_tmpl(
    Mesh* mesh, AdaptOpts const& opts, LOs cands2edges) {
  auto e2t = mesh->ask_up(EDGE, FACE);
  auto e2et = e2t.a2ab;
  auto et2t = e2t.ab2b;
  auto et_codes = e2t.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tri_verts2verts = mesh->ask_verts_of(FACE);
  auto edges_are_owned = mesh->owned(EDGE);
  auto quality_measure = MetricElementQualities<2, metric_dim>(mesh);
  auto length_measure = MetricEdgeLengths<2, metric_dim>(mesh);
  auto max_length = opts.max_length_allowed;
  auto ncands = cands2edges.size();
  auto cand_quals_w = Write<Real>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto edge = cands2edges[cand];
    /* non-owned edges will have incomplete cavities
       and will run into the topological assertions
       in find_loop(). don't bother; their results
       will be overwritten by the owner's anyways */
    if (!edges_are_owned[edge]) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    OMEGA_H_CHECK(e2et[edge + 1] == 2 + e2et[edge]);
    LO t[2];
    Few<LO, 2> ov;
    for (Int i = 0; i < 2; ++i) {
      auto et = e2et[edge] + i;
      auto code = et_codes[et];
      auto tte = code_which_down(code);
      auto rot = code_rotation(code);
      t[rot] = et2t[et];
      auto ttv = simplex_opposite_template(FACE, EDGE, tte);
      ov[rot] = tri_verts2verts[t[rot] * 3 + ttv];
    }
    auto l = length_measure.measure(ov);
    if (l > max_length) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    auto ev = gather_verts<2>(edge_verts2verts, edge);
    Real minqual = 1.0;
    for (Int i = 0; i < 2; ++i) {
      Few<LO, 3> ntv;
      ntv[0] = ev[1 - i];
      ntv[1] = ov[i];
      ntv[2] = ov[1 - i];
      auto qual = quality_measure.measure(ntv);
      minqual = min2(minqual, qual);
    }
    cand_quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "swap2d_qualities");
  auto cand_quals = Reals(cand_quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, cands2edges, -1.0, 1);
}